

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ModBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_modbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x361) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x361;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    ModBroadcastableLayerParams::ModBroadcastableLayerParams(this_00.modbroadcastable_);
    (this->layer_).modbroadcastable_ = (ModBroadcastableLayerParams *)this_00;
  }
  return (ModBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ModBroadcastableLayerParams* NeuralNetworkLayer::mutable_modbroadcastable() {
  if (!has_modbroadcastable()) {
    clear_layer();
    set_has_modbroadcastable();
    layer_.modbroadcastable_ = new ::CoreML::Specification::ModBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.modBroadcastable)
  return layer_.modbroadcastable_;
}